

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

int __thiscall CmdLineArgsParser::Parse(CmdLineArgsParser *this,int argc,LPWSTR *argv)

{
  char16 *pcVar1;
  int local_28;
  int local_24;
  int i;
  int err;
  LPWSTR *argv_local;
  int argc_local;
  CmdLineArgsParser *this_local;
  
  local_24 = 0;
  local_28 = 1;
  while ((local_28 < argc && (local_24 = Parse(this,argv[local_28]), local_24 == 0))) {
    local_28 = local_28 + 1;
  }
  pcVar1 = Js::String::operator_cast_to_char16_t_(&this->flagTable->Filename);
  if (pcVar1 == (char16 *)0x0) {
    Js::String::operator=(&this->flagTable->Filename,L"ttdSentinal.js");
  }
  return local_24;
}

Assistant:

int
CmdLineArgsParser::Parse(int argc, __in_ecount(argc) LPWSTR argv[])
{
    int err = 0;

    for(int i = 1; i < argc; i++)
    {
        if ((err = Parse(argv[i])) != 0)
        {
            break;
        }
    }

    if(this->flagTable.Filename == nullptr)
    {
        this->flagTable.Filename = _u("ttdSentinal.js");
    }

    return err;
}